

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# khash_str2int.h
# Opt level: O2

int khash_str2int_get(void *_hash,char *str,int *value)

{
  khint_t kVar1;
  int iVar2;
  
  iVar2 = -1;
  if (_hash != (void *)0x0) {
    kVar1 = kh_get_str2int((kh_str2int_t *)_hash,str);
    if ((kVar1 != *_hash) && (iVar2 = 0, value != (int *)0x0)) {
      *value = *(int *)(*(long *)((long)_hash + 0x20) + (ulong)kVar1 * 4);
    }
  }
  return iVar2;
}

Assistant:

static inline int khash_str2int_get(void *_hash, const char *str, int *value)
{
    khash_t(str2int) *hash = (khash_t(str2int)*)_hash;
    khint_t k;
    if ( !hash ) return -1;
    k = kh_get(str2int, hash, str);
    if ( k == kh_end(hash) ) return -1;
    if ( !value ) return 0;
    *value = kh_val(hash, k);
    return 0;
}